

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::
WalkSerialArenaChunk<google::protobuf::internal::ThreadSafeArena::Free()::__0>
          (ThreadSafeArena *this,anon_class_8_1_b0f9390a fn)

{
  bool bVar1;
  SerialArenaChunk *pSVar2;
  SerialArenaChunk *next_chunk;
  SerialArenaChunk *chunk;
  ThreadSafeArena *this_local;
  anon_class_8_1_b0f9390a fn_local;
  
  this_local = (ThreadSafeArena *)fn.deallocator;
  next_chunk = std::atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*>::load
                         (&this->head_,memory_order_relaxed);
  while( true ) {
    bVar1 = SerialArenaChunk::IsSentry(next_chunk);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar2 = SerialArenaChunk::next_chunk(next_chunk);
    fn_local.deallocator = (GetDeallocator *)pSVar2;
    Free::anon_class_8_1_b0f9390a::operator()((anon_class_8_1_b0f9390a *)&this_local,next_chunk);
    next_chunk = pSVar2;
  }
  return;
}

Assistant:

void ThreadSafeArena::WalkSerialArenaChunk(Callback fn) {
  // By omitting an Acquire barrier we help the sanitizer that any user code
  // that doesn't properly synchronize Reset() or the destructor will throw a
  // TSAN warning.
  SerialArenaChunk* chunk = head_.load(std::memory_order_relaxed);

  while (!chunk->IsSentry()) {
    // Cache next chunk in case this chunk is destroyed.
    SerialArenaChunk* next_chunk = chunk->next_chunk();
    // Prefetch the next chunk.
    absl::PrefetchToLocalCache(next_chunk);
    fn(chunk);
    chunk = next_chunk;
  }
}